

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smtp.c
# Opt level: O3

CURLcode smtp_setup_connection(connectdata *conn)

{
  undefined1 *puVar1;
  Curl_easy *pCVar2;
  CURLcode CVar3;
  void *pvVar4;
  Curl_easy *data;
  
  puVar1 = &(conn->bits).field_0x8;
  *puVar1 = *puVar1 & 0xfe;
  pCVar2 = conn->data;
  pvVar4 = (*Curl_ccalloc)(0x30,1);
  (pCVar2->req).protop = pvVar4;
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (pvVar4 != (void *)0x0) {
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode smtp_setup_connection(struct connectdata *conn)
{
  CURLcode result;

  /* Clear the TLS upgraded flag */
  conn->bits.tls_upgraded = FALSE;

  /* Initialise the SMTP layer */
  result = smtp_init(conn);
  if(result)
    return result;

  return CURLE_OK;
}